

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_bytedata.cpp
# Opt level: O1

Serializer * __thiscall cfd::core::Serializer::operator<<(Serializer *this,uint8_t byte_data)

{
  CheckNeedSize(this,4);
  (this->buffer_).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start[this->offset_] = byte_data;
  this->offset_ = this->offset_ + 1;
  return this;
}

Assistant:

Serializer& Serializer::operator<<(uint8_t byte_data) {
  AddDirectByte(byte_data);
  return *this;
}